

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::BuildEngineTest_discoveredDependencies_Test::TestBody()::
TaskWithDiscoveredDependency::inputsAvailable(llbuild::core::TaskInterface_
          (void *this,TaskInterface ti)

{
  KeyType KStack_48;
  TaskInterface local_28;
  
  local_28.ctx = ti.ctx;
  local_28.impl = ti.impl;
  llbuild::core::KeyType::KeyType(&KStack_48,"value-B");
  llbuild::core::TaskInterface::discoveredDependency(&local_28,&KStack_48);
  std::__cxx11::string::_M_dispose();
  anon_unknown.dwarf_1cf4b::intToValue
            ((ValueType *)&KStack_48,*(int *)((long)this + 0x10) * **(int **)((long)this + 8) * 5);
  llbuild::core::TaskInterface::complete(&local_28,(ValueType *)&KStack_48,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&KStack_48);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
      // Report the discovered dependency.
      ti.discoveredDependency("value-B");
      ti.complete(intToValue(computedInputValue * valueB * 5));
    }